

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

void LexHexadecimal(SQChar *s,SQUnsignedInteger *res)

{
  int iVar1;
  SQUnsignedInteger SVar2;
  int iVar3;
  
  SVar2 = 0;
  do {
    *res = SVar2;
    iVar3 = (int)*s;
    if (*s == '\0') {
      return;
    }
    if (iVar3 - 0x30U < 10) {
      SVar2 = SVar2 << 4 | (ulong)(iVar3 - 0x30U);
    }
    else {
      iVar1 = isxdigit(iVar3);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqlexer.cpp"
                      ,0x1c3,"void LexHexadecimal(const SQChar *, SQUnsignedInteger *)");
      }
      iVar3 = toupper(iVar3);
      SVar2 = (SVar2 * 0x10 + (long)iVar3) - 0x37;
    }
    s = s + 1;
  } while( true );
}

Assistant:

void LexHexadecimal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisdigit(*s)) *res = (*res)*16+((*s++)-'0');
        else if(scisxdigit(*s)) *res = (*res)*16+(toupper(*s++)-'A'+10);
        else { assert(0); }
    }
}